

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ChElementBeamTaperedTimoshenkoFPM
          (ChElementBeamTaperedTimoshenkoFPM *this)

{
  ChMatrixDynamic<> *pCVar1;
  int iVar2;
  int iVar3;
  ActualDstType actualDst;
  assign_op<double,_double> local_39;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_38;
  
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableU =
       (ChLoadableU)&PTR__ChLoadable_00b2c638;
  ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko
            (&this->super_ChElementBeamTaperedTimoshenko,&PTR_construction_vtable_24__00b5a230);
  (this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
  super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb59ea0;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableU = (ChLoadableU)0xb5a090;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChLoadableUVW = (ChLoadableUVW)0xb5a178;
  (this->super_ChElementBeamTaperedTimoshenko).super_ChElementCorotational.
  _vptr_ChElementCorotational = (_func_int **)0xb5a210;
  (this->tapered_section_fpm).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->tapered_section_fpm).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->guass_order = 4;
  if (this != (ChElementBeamTaperedTimoshenkoFPM *)(sBulletDNAstr64 + 0x3558)) {
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotA.m_data[0] = QUNIT;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotA.m_data[1] = DAT_00b90978;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotA.m_data[2] = DAT_00b90980;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotA.m_data[3] = DAT_00b90988;
  }
  if (this != (ChElementBeamTaperedTimoshenkoFPM *)(sBulletDNAstr64 + 0x3538)) {
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotB.m_data[0] = QUNIT;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotB.m_data[1] = DAT_00b90978;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotB.m_data[2] = DAT_00b90980;
    (this->super_ChElementBeamTaperedTimoshenko).q_refrotB.m_data[3] = DAT_00b90988;
  }
  if (this != (ChElementBeamTaperedTimoshenkoFPM *)(sBulletDNAstr64 + 0x3518)) {
    (this->super_ChElementBeamTaperedTimoshenko).q_element_abs_rot.m_data[0] = QUNIT;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_abs_rot.m_data[1] = DAT_00b90978;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_abs_rot.m_data[2] = DAT_00b90980;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_abs_rot.m_data[3] = DAT_00b90988;
  }
  if (this != (ChElementBeamTaperedTimoshenkoFPM *)(sBulletDNAstr64 + 0x34f8)) {
    (this->super_ChElementBeamTaperedTimoshenko).q_element_ref_rot.m_data[0] = QUNIT;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_ref_rot.m_data[1] = DAT_00b90978;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_ref_rot.m_data[2] = DAT_00b90980;
    (this->super_ChElementBeamTaperedTimoshenko).q_element_ref_rot.m_data[3] = DAT_00b90988;
  }
  (this->super_ChElementBeamTaperedTimoshenko).disable_corotate = false;
  (this->super_ChElementBeamTaperedTimoshenko).force_symmetric_stiffness = false;
  (this->super_ChElementBeamTaperedTimoshenko).use_geometric_stiffness = true;
  (this->super_ChElementBeamTaperedTimoshenko).use_Rc = true;
  (this->super_ChElementBeamTaperedTimoshenko).use_Rs = true;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&(this->super_ChElementBeamTaperedTimoshenko).nodes,2);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Km.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Kg.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).M.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Rm.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Ri.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).Ki.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  iVar2 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->super_ChElementBeamTaperedTimoshenko).T.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2,
             (long)iVar3);
  pCVar1 = &(this->super_ChElementBeamTaperedTimoshenko).Rs;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)pCVar1,0x24,6,6);
  local_38.m_rows.m_value =
       (this->super_ChElementBeamTaperedTimoshenko).Rs.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
  local_38.m_cols.m_value =
       (this->super_ChElementBeamTaperedTimoshenko).Rs.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
  if (-1 < (local_38.m_cols.m_value | local_38.m_rows.m_value)) {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (pCVar1,&local_38,&local_39);
    pCVar1 = &(this->super_ChElementBeamTaperedTimoshenko).Rc;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)pCVar1,0x24,6,6);
    local_38.m_rows.m_value =
         (this->super_ChElementBeamTaperedTimoshenko).Rc.
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
    local_38.m_cols.m_value =
         (this->super_ChElementBeamTaperedTimoshenko).Rc.
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    if (-1 < (local_38.m_cols.m_value | local_38.m_rows.m_value)) {
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                (pCVar1,&local_38,&local_39);
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementBeamTaperedTimoshenkoFPM::ChElementBeamTaperedTimoshenkoFPM() : guass_order(4) {
    q_refrotA = QUNIT;
    q_refrotB = QUNIT;
    q_element_abs_rot = QUNIT;
    q_element_ref_rot = QUNIT;
    force_symmetric_stiffness = false;
    disable_corotate = false;
    use_geometric_stiffness = true;
    use_Rc = true;
    use_Rs = true;

    nodes.resize(2);

    Km.setZero(this->GetNdofs(), this->GetNdofs());
    Kg.setZero(this->GetNdofs(), this->GetNdofs());
    M.setZero(this->GetNdofs(), this->GetNdofs());
    Rm.setZero(this->GetNdofs(), this->GetNdofs());
    Ri.setZero(this->GetNdofs(), this->GetNdofs());
    Ki.setZero(this->GetNdofs(), this->GetNdofs());

    T.setZero(this->GetNdofs(), this->GetNdofs());
    Rs.setIdentity(6, 6);
    Rc.setIdentity(6, 6);
}